

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_codeABx(FuncState *fs,OpCode o,int a,uint bc)

{
  int iVar1;
  uint bc_local;
  int a_local;
  OpCode o_local;
  FuncState *fs_local;
  
  if (((luaP_opmodes[o] & 3) != 1) && ((luaP_opmodes[o] & 3) != 2)) {
    __assert_fail("(((enum OpMode)(luaP_opmodes[o] & 3))) == iABx || (((enum OpMode)(luaP_opmodes[o] & 3))) == iAsBx"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x151,"int luaK_codeABx(FuncState *, OpCode, int, unsigned int)");
  }
  if (((int)(uint)luaP_opmodes[o] >> 2 & 3U) != 0) {
    __assert_fail("(((enum OpArgMask)((luaP_opmodes[o] >> 2) & 3))) == OpArgN",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x152,"int luaK_codeABx(FuncState *, OpCode, int, unsigned int)");
  }
  if ((a < 0x80) && (bc < 0x10000)) {
    iVar1 = luaK_code(fs,o | a << 8 | bc << 0x10);
    return iVar1;
  }
  __assert_fail("a <= 0x7f && bc <= 0xffff",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x153,"int luaK_codeABx(FuncState *, OpCode, int, unsigned int)");
}

Assistant:

int luaK_codeABx (FuncState *fs, OpCode o, int a, unsigned int bc) {
  lua_assert(getOpMode(o) == iABx || getOpMode(o) == iAsBx);
  lua_assert(getCMode(o) == OpArgN);
  lua_assert(a <= MAXARG_A && bc <= MAXARG_Bx);
  return luaK_code(fs, CREATE_ABx(o, a, bc));
}